

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O2

void my_output_message(j_common_ptr cinfo)

{
  long in_FS_OFFSET;
  char buffer [200];
  char local_108 [24];
  char *local_f0;
  char local_e8 [208];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_e8,0xaa,200);
  (*cinfo->err->format_message)(cinfo,local_e8);
  lcJpeg();
  if (((byte)lcJpeg::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
    local_108[0] = '\x02';
    local_108[1] = '\0';
    local_108[2] = '\0';
    local_108[3] = '\0';
    local_108[4] = '\0';
    local_108[5] = '\0';
    local_108[6] = '\0';
    local_108[7] = '\0';
    local_108[8] = '\0';
    local_108[9] = '\0';
    local_108[10] = '\0';
    local_108[0xb] = '\0';
    local_108[0xc] = '\0';
    local_108[0xd] = '\0';
    local_108[0xe] = '\0';
    local_108[0xf] = '\0';
    local_108[0x10] = '\0';
    local_108[0x11] = '\0';
    local_108[0x12] = '\0';
    local_108[0x13] = '\0';
    local_108[0x14] = '\0';
    local_108[0x15] = '\0';
    local_108[0x16] = '\0';
    local_108[0x17] = '\0';
    local_f0 = lcJpeg::category.name;
    QMessageLogger::warning(local_108,"%s",local_e8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void my_output_message(j_common_ptr cinfo)
{
    char buffer[JMSG_LENGTH_MAX];
    (*cinfo->err->format_message)(cinfo, buffer);
    qCWarning(lcJpeg,"%s", buffer);
}